

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_extension.cc
# Opt level: O1

void __thiscall MallocExtension::GetHeapSample(MallocExtension *this,MallocExtensionWriter *writer)

{
  void *pvVar1;
  int iVar2;
  undefined4 extraout_var;
  void **entry;
  char local_48 [8];
  char label [32];
  int sample_period;
  void **entries;
  
  label[0x1c] = '\0';
  label[0x1d] = '\0';
  label[0x1e] = '\0';
  label[0x1f] = '\0';
  iVar2 = (*this->_vptr_MallocExtension[0x19])();
  entries = (void **)CONCAT44(extraout_var,iVar2);
  if (entries == (void **)0x0) {
    std::__cxx11::string::append((char *)writer,0x136c20);
  }
  else {
    snprintf(local_48,0x20,"heap_v2/%d",(ulong)(uint)label._28_4_);
    anon_unknown.dwarf_4a0a3::PrintHeader(writer,local_48,entries);
    pvVar1 = *entries;
    entry = entries;
    while (pvVar1 != (void *)0x0) {
      anon_unknown.dwarf_4a0a3::PrintStackEntry(writer,entry);
      entry = entry + (long)entry[2] + 3;
      pvVar1 = *entry;
    }
    operator_delete__(entries);
    DumpAddressMap(writer);
  }
  return;
}

Assistant:

void MallocExtension::GetHeapSample(MallocExtensionWriter* writer) {
  int sample_period = 0;
  void** entries = ReadStackTraces(&sample_period);
  if (entries == nullptr) {
    const char* const kErrorMsg =
        "This malloc implementation does not support sampling.\n"
        "As of 2005/01/26, only tcmalloc supports sampling, and\n"
        "you are probably running a binary that does not use\n"
        "tcmalloc.\n";
    writer->append(kErrorMsg, strlen(kErrorMsg));
    return;
  }

  char label[32];
  snprintf(label, sizeof(label), "heap_v2/%d", sample_period);
  PrintHeader(writer, label, entries);
  for (void** entry = entries; Count(entry) != 0; entry += 3 + Depth(entry)) {
    PrintStackEntry(writer, entry);
  }
  delete[] entries;

  DumpAddressMap(writer);
}